

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StructureDecode(u8 *pData,int nData,int *piCookie,Fts5Structure **ppOut)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  u32 *v;
  Fts5StructureSegment *pSeg;
  int iSeg;
  int nTotal;
  Fts5StructureLevel *pLvl;
  Fts5Structure *pRet;
  sqlite3_int64 nByte;
  u32 local_40;
  int nSegment;
  int nLevel;
  int iLvl;
  int i;
  int rc;
  Fts5Structure **ppOut_local;
  int *piCookie_local;
  u8 *puStack_18;
  int nData_local;
  u8 *pData_local;
  
  iLvl = 0;
  nLevel = 0;
  local_40 = 0;
  nByte._4_4_ = 0;
  pLvl = (Fts5StructureLevel *)0x0;
  _i = ppOut;
  ppOut_local = (Fts5Structure **)piCookie;
  piCookie_local._4_4_ = nData;
  puStack_18 = pData;
  if (piCookie != (int *)0x0) {
    iVar2 = sqlite3Fts5Get32(pData);
    *(int *)ppOut_local = iVar2;
  }
  nLevel = 4;
  iVar2 = sqlite3Fts5GetVarint32(puStack_18 + 4,&local_40);
  nLevel = iVar2 + nLevel;
  iVar2 = sqlite3Fts5GetVarint32(puStack_18 + nLevel,(u32 *)((long)&nByte + 4));
  nLevel = iVar2 + nLevel;
  if (((((int)local_40 < 0x7d1) && (-1 < (int)local_40)) && (nByte._4_4_ < 0x7d1)) &&
     (-1 < nByte._4_4_)) {
    pRet = (Fts5Structure *)((long)(int)(local_40 - 1) * 0x10 + 0x28);
    pLvl = (Fts5StructureLevel *)sqlite3Fts5MallocZero(&iLvl,(sqlite3_int64)pRet);
    if (pLvl != (Fts5StructureLevel *)0x0) {
      pLvl->nMerge = 1;
      pLvl[1].nSeg = local_40;
      pLvl[1].nMerge = nByte._4_4_;
      bVar1 = sqlite3Fts5GetVarint(puStack_18 + nLevel,(u64 *)&pLvl->aSeg);
      nLevel = (uint)bVar1 + nLevel;
      for (nSegment = 0; iLvl == 0 && nSegment < (int)local_40; nSegment = nSegment + 1) {
        _iSeg = &pLvl[(long)nSegment + 1].aSeg;
        pSeg._4_4_ = 0;
        if (nLevel < piCookie_local._4_4_) {
          iVar2 = sqlite3Fts5GetVarint32(puStack_18 + nLevel,(u32 *)_iSeg);
          nLevel = iVar2 + nLevel;
          iVar2 = sqlite3Fts5GetVarint32(puStack_18 + nLevel,(u32 *)((long)&pSeg + 4));
          nLevel = iVar2 + nLevel;
          if (pSeg._4_4_ < *(int *)_iSeg) {
            iLvl = 0x10b;
          }
          pvVar3 = sqlite3Fts5MallocZero(&iLvl,(long)pSeg._4_4_ * 0xc);
          _iSeg[1] = (Fts5StructureSegment *)pvVar3;
          nByte._4_4_ = nByte._4_4_ - pSeg._4_4_;
        }
        else {
          iLvl = 0x10b;
        }
        if (iLvl == 0) {
          *(int *)((long)_iSeg + 4) = pSeg._4_4_;
          for (pSeg._0_4_ = 0; (int)pSeg < pSeg._4_4_; pSeg._0_4_ = (int)pSeg + 1) {
            v = (u32 *)((long)_iSeg[1] + (long)(int)pSeg * 0xc);
            if (piCookie_local._4_4_ <= nLevel) {
              iLvl = 0x10b;
              break;
            }
            iVar2 = sqlite3Fts5GetVarint32(puStack_18 + nLevel,v);
            nLevel = iVar2 + nLevel;
            iVar2 = sqlite3Fts5GetVarint32(puStack_18 + nLevel,v + 1);
            nLevel = iVar2 + nLevel;
            iVar2 = sqlite3Fts5GetVarint32(puStack_18 + nLevel,v + 2);
            nLevel = iVar2 + nLevel;
            if ((int)v[2] < (int)v[1]) {
              iLvl = 0x10b;
              break;
            }
          }
          if (((0 < nSegment) && (*(int *)(_iSeg + -2) != 0)) && (pSeg._4_4_ == 0)) {
            iLvl = 0x10b;
          }
          if ((nSegment == local_40 - 1) && (*(int *)_iSeg != 0)) {
            iLvl = 0x10b;
          }
        }
      }
      if ((nByte._4_4_ != 0) && (iLvl == 0)) {
        iLvl = 0x10b;
      }
      if (iLvl != 0) {
        fts5StructureRelease((Fts5Structure *)pLvl);
        pLvl = (Fts5StructureLevel *)0x0;
      }
    }
    *_i = (Fts5Structure *)pLvl;
    pData_local._4_4_ = iLvl;
  }
  else {
    pData_local._4_4_ = 0x10b;
  }
  return pData_local._4_4_;
}

Assistant:

static int fts5StructureDecode(
  const u8 *pData,                /* Buffer containing serialized structure */
  int nData,                      /* Size of buffer pData in bytes */
  int *piCookie,                  /* Configuration cookie value */
  Fts5Structure **ppOut           /* OUT: Deserialized object */
){
  int rc = SQLITE_OK;
  int i = 0;
  int iLvl;
  int nLevel = 0;
  int nSegment = 0;
  sqlite3_int64 nByte;            /* Bytes of space to allocate at pRet */
  Fts5Structure *pRet = 0;        /* Structure object to return */

  /* Grab the cookie value */
  if( piCookie ) *piCookie = sqlite3Fts5Get32(pData);
  i = 4;

  /* Read the total number of levels and segments from the start of the
  ** structure record.  */
  i += fts5GetVarint32(&pData[i], nLevel);
  i += fts5GetVarint32(&pData[i], nSegment);
  if( nLevel>FTS5_MAX_SEGMENT   || nLevel<0
   || nSegment>FTS5_MAX_SEGMENT || nSegment<0
  ){
    return FTS5_CORRUPT;
  }
  nByte = (
      sizeof(Fts5Structure) +                    /* Main structure */
      sizeof(Fts5StructureLevel) * (nLevel-1)    /* aLevel[] array */
  );
  pRet = (Fts5Structure*)sqlite3Fts5MallocZero(&rc, nByte);

  if( pRet ){
    pRet->nRef = 1;
    pRet->nLevel = nLevel;
    pRet->nSegment = nSegment;
    i += sqlite3Fts5GetVarint(&pData[i], &pRet->nWriteCounter);

    for(iLvl=0; rc==SQLITE_OK && iLvl<nLevel; iLvl++){
      Fts5StructureLevel *pLvl = &pRet->aLevel[iLvl];
      int nTotal = 0;
      int iSeg;

      if( i>=nData ){
        rc = FTS5_CORRUPT;
      }else{
        i += fts5GetVarint32(&pData[i], pLvl->nMerge);
        i += fts5GetVarint32(&pData[i], nTotal);
        if( nTotal<pLvl->nMerge ) rc = FTS5_CORRUPT;
        pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(&rc, 
            nTotal * sizeof(Fts5StructureSegment)
        );
        nSegment -= nTotal;
      }

      if( rc==SQLITE_OK ){
        pLvl->nSeg = nTotal;
        for(iSeg=0; iSeg<nTotal; iSeg++){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          if( i>=nData ){
            rc = FTS5_CORRUPT;
            break;
          }
          i += fts5GetVarint32(&pData[i], pSeg->iSegid);
          i += fts5GetVarint32(&pData[i], pSeg->pgnoFirst);
          i += fts5GetVarint32(&pData[i], pSeg->pgnoLast);
          if( pSeg->pgnoLast<pSeg->pgnoFirst ){
            rc = FTS5_CORRUPT;
            break;
          }
        }
        if( iLvl>0 && pLvl[-1].nMerge && nTotal==0 ) rc = FTS5_CORRUPT;
        if( iLvl==nLevel-1 && pLvl->nMerge ) rc = FTS5_CORRUPT;
      }
    }
    if( nSegment!=0 && rc==SQLITE_OK ) rc = FTS5_CORRUPT;

    if( rc!=SQLITE_OK ){
      fts5StructureRelease(pRet);
      pRet = 0;
    }
  }

  *ppOut = pRet;
  return rc;
}